

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

DynamicTypeHandler * __thiscall
Js::SimpleTypeHandler<1UL>::ConvertToTypeWithItemAttributes
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance)

{
  int *piVar1;
  bool bVar2;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar3;
  
  bVar2 = JavascriptArray::IsNonES5Array(instance);
  if (bVar2) {
    pEVar3 = SimpleTypeHandler<1ul>::
             ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
                       ((SimpleTypeHandler<1ul> *)this,instance);
  }
  else {
    pEVar3 = (ES5ArrayTypeHandlerBase<unsigned_short> *)
             SimpleTypeHandler<1ul>::
             ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
                       ((SimpleTypeHandler<1ul> *)this,instance);
  }
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertSimpleToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return (DynamicTypeHandler *)pEVar3;
}

Assistant:

DynamicTypeHandler* SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }